

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O2

bool __thiscall axl::cry::X509Store::create(X509Store *this)

{
  bool bVar1;
  X509_STORE *pXVar2;
  int in_ESI;
  
  sl::Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>::close
            (&this->
              super_Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>
             ,in_ESI);
  pXVar2 = X509_STORE_new();
  (this->super_Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>).
  m_h = (x509_store_st *)pXVar2;
  bVar1 = completeWithLastCryptoError((uint)(pXVar2 != (X509_STORE *)0x0));
  return bVar1;
}

Assistant:

bool
X509Store::create() {
	close();
	m_h = X509_STORE_new();
	return completeWithLastCryptoError(m_h != NULL);
}